

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssmain.cpp
# Opt level: O2

void compile(void)

{
  _cl::Init();
  _cl::LoadScriptSource();
  _cl::PreProcessSourceCode();
  compiler.tempVar0SymbolIndex = _cl::AddSymbol(&compiler.symbolTable,1,0,2,"_T0");
  compiler.tempVar1SymbolIndex = _cl::AddSymbol(&compiler.symbolTable,1,0,2,"_T1");
  _cl::ParseSourceCode();
  _IL::OutCode();
  return;
}

Assistant:

void compile()
{
	_cl::Init();

	_cl::LoadScriptSource();
	_cl::PreProcessSourceCode();

	compiler.tempVar0SymbolIndex = _cl::AddSymbol(&compiler.symbolTable, 1,
		SCOPE_GLOBAL, SYMBOL_TYPE_VAR, TEMP_VAR_0);
	compiler.tempVar1SymbolIndex = _cl::AddSymbol(&compiler.symbolTable, 1,
		SCOPE_GLOBAL, SYMBOL_TYPE_VAR, TEMP_VAR_1);

	_cl::ParseSourceCode();

	_IL::OutCode();
}